

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::State::SkipWithError(State *this,char *msg)

{
  int *piVar1;
  TimerManager *this_00;
  char *pcVar2;
  unique_lock<std::mutex> local_28;
  
  if (msg == (char *)0x0) {
    internal::CheckHandler::CheckHandler
              ((CheckHandler *)&local_28,"msg",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"SkipWithError",0x3e3);
    internal::CheckHandler::~CheckHandler((CheckHandler *)&local_28);
  }
  internal::GetNullLogInstance();
  this->error_occurred_ = true;
  LOCK();
  pcVar2 = msg;
  if ((anonymous_namespace)::error_message != (char *)0x0) {
    pcVar2 = (anonymous_namespace)::error_message;
  }
  (anonymous_namespace)::error_message = pcVar2;
  UNLOCK();
  this->started_ = true;
  this->finished_ = true;
  this->total_iterations_ = this->max_iterations;
  this_00 = (anonymous_namespace)::timer_manager;
  local_28._M_device = (mutex_type *)(anonymous_namespace)::timer_manager;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  piVar1 = &this_00->running_threads_;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    if (this_00->running_ == true) {
      anon_unknown_1::TimerManager::InternalStop(this_00);
    }
  }
  else {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void State::SkipWithError(const char* msg) {
  CHECK(msg);
  error_occurred_ = true;
  error_message_type expected_no_error_msg = nullptr;
  error_message.compare_exchange_weak(expected_no_error_msg,
    const_cast<error_message_type>(msg));
  started_ = finished_ = true;
  total_iterations_ = max_iterations;
  timer_manager->RemoveErroredThread();
}